

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O3

void __thiscall
std::pmr::test_resource::do_deallocate(test_resource *this,void *p,size_t bytes,size_t alignment)

{
  uint uVar1;
  undefined8 uVar2;
  test_resource_list *ptVar3;
  memory_resource *pmVar4;
  Link *pLVar5;
  Link *pLVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  test_resource_list *ptVar11;
  char *pcVar12;
  Link **ppLVar13;
  uint uVar14;
  uint uVar15;
  size_t sVar16;
  
  iVar7 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock_);
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
    goto LAB_001034ed;
  }
  LOCK();
  (this->m_deallocations_).super___atomic_base<long_long>._M_i =
       (this->m_deallocations_).super___atomic_base<long_long>._M_i + 1;
  UNLOCK();
  (this->m_last_deallocated_address_)._M_b._M_p = p;
  if (p == (void *)0x0) {
    if (bytes == 0) {
      (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = 0;
      (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i = alignment;
      goto LAB_00103360;
    }
    LOCK();
    (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
         (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
    UNLOCK();
    if ((this->m_quiet_flag_).super___atomic_base<int>._M_i != 0) goto LAB_00103360;
    printf("*** Freeing a nullptr using non-zero size (%zu) with alignment (%zu). ***\n",bytes,
           alignment);
  }
  else {
    uVar15 = 0;
    lVar8 = 0x40;
    if (*(int *)((long)p + -0x40) == -0x21524111) {
      uVar14 = 0;
      uVar15 = 0;
      if (*(test_resource **)((long)p + -0x18) != this) goto LAB_001031a4;
      uVar2 = *(undefined8 *)((long)p + -0x28);
      uVar10 = 0;
      do {
        if (*(char *)((long)p + (uVar10 - 1)) != -0x4f) {
          uVar14 = 1 - (int)uVar10;
          goto LAB_0010337d;
        }
        uVar10 = uVar10 - 1;
      } while (0xfffffffffffffff0 < uVar10);
      lVar8 = 0;
      do {
        if (*(char *)((long)p + lVar8 + *(size_t *)((long)p + -0x38)) != -0x4f) {
          uVar15 = (int)lVar8 + 1;
          goto LAB_00103387;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      uVar14 = 0;
LAB_0010337d:
      uVar15 = 0;
LAB_00103387:
      if ((*(size_t *)((long)p + -0x38) == bytes) && (*(size_t *)((long)p + -0x30) == alignment)) {
        lVar8 = 0x48;
        if (uVar15 == 0 && uVar14 == 0) {
          ptVar3 = this->m_list_;
          pmVar4 = this->m_pmr_;
          pLVar5 = *(Link **)((long)p + -0x20);
          pLVar6 = pLVar5->m_prev_;
          if (ptVar3->d_tail_p == pLVar5) {
            ppLVar13 = &ptVar3->d_tail_p;
          }
          else {
            ppLVar13 = &pLVar5->m_next_->m_prev_;
          }
          *ppLVar13 = pLVar6;
          ptVar11 = (test_resource_list *)&pLVar6->m_next_;
          if (ptVar3->d_head_p == pLVar5) {
            ptVar11 = ptVar3;
          }
          ptVar11->d_head_p = pLVar5->m_next_;
          (**(code **)(*(long *)pmVar4 + 0x18))(pmVar4,pLVar5,0x18,8);
          (this->m_last_deallocated_num_bytes_).super___atomic_base<unsigned_long>._M_i = bytes;
          (this->m_last_deallocated_alignment_).super___atomic_base<unsigned_long>._M_i = alignment;
          LOCK();
          (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i =
               (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i + -1;
          UNLOCK();
          LOCK();
          (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i =
               (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i - bytes;
          UNLOCK();
          *(undefined4 *)((long)p + -0x40) = 0xdeadf00d;
          memset(p,0xa5,bytes);
          if ((this->m_verbose_flag_).super___atomic_base<int>._M_i != 0) {
            printf("test_resource");
            sVar16 = (this->m_name_)._M_len;
            if (sVar16 != 0) {
              printf(" %.*s",sVar16,(this->m_name_)._M_str);
            }
            pcVar12 = "s ";
            if (bytes == 1) {
              pcVar12 = " ";
            }
            printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",uVar2,bytes,pcVar12,
                   alignment,p);
            fflush(_stdout);
          }
          (**(code **)(*(long *)this->m_pmr_ + 0x18))
                    (this->m_pmr_,(void *)((long)p + -0x40),bytes + 0x50,0x10);
          goto LAB_00103360;
        }
        goto LAB_001031a4;
      }
      LOCK();
      (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i =
           (this->m_bad_deallocate_params_).super___atomic_base<long_long>._M_i + 1;
      UNLOCK();
      lVar8 = 0x48;
      if (uVar15 != 0 || uVar14 != 0) goto LAB_001031a4;
    }
    else {
      uVar14 = 0;
LAB_001031a4:
      LOCK();
      *(long *)(&this->super_memory_resource + lVar8) =
           *(long *)(&this->super_memory_resource + lVar8) + 1;
      UNLOCK();
    }
    if ((this->m_quiet_flag_).super___atomic_base<int>._M_i != 0) goto LAB_00103360;
    uVar1 = *(uint *)((long)p + -0x40);
    uVar10 = *(ulong *)((long)p + -0x38);
    if (uVar1 == 0xdeadbeef) {
      uVar2 = *(undefined8 *)((long)p + -0x30);
      uVar9 = uVar10;
      if (uVar10 == 0) {
        printf("*** Invalid (non-positive) byte count %zu at address %p. *** \n",0,p);
        uVar9 = *(ulong *)((long)p + -0x38);
      }
      if (uVar9 != bytes) {
        printf("*** Freeing segment at %p using wrong size (%zu vs. %zu). ***\n",p,bytes,uVar10);
      }
      if (*(size_t *)((long)p + -0x30) != alignment) {
        printf("*** Freeing segment at %p using wrong alignment (%zu vs. %zu). ***\n",p,alignment,
               uVar2);
      }
      if (*(test_resource **)((long)p + -0x18) != this) {
        printf("*** Freeing segment at %p from wrong allocator. ***\n",p);
      }
      if (uVar14 != 0) {
        printf("*** Memory corrupted at %d bytes before %zu byte segment at %p. ***\n",(ulong)uVar14
               ,uVar10,p);
        puts("Pad area before user segment:");
        formatBlock((void *)((long)p + -0x10),0x10);
      }
      if (uVar15 != 0) {
        printf("*** Memory corrupted at %d bytes after %zu byte segment at %p. ***\n",(ulong)uVar15,
               uVar10,p);
        puts("Pad area after user segment:");
        formatBlock((void *)((long)p + uVar10),0x10);
      }
    }
    else if (uVar1 == 0xdeadf00d) {
      printf("*** Deallocating previously deallocated memory at %p. ***\n",p);
    }
    else {
      printf("*** Invalid magic number 0x%08x at address %p. ***\n",(ulong)uVar1,p);
    }
    puts("Header:");
    formatBlock((void *)((long)p + -0x40),0x40);
    puts("User segment:");
    sVar16 = 0x40;
    if (uVar10 < 0x40) {
      sVar16 = uVar10;
    }
    formatBlock(p,sVar16);
  }
  if ((this->m_no_abort_flag_).super___atomic_base<int>._M_i == 0) {
LAB_001034ed:
    abort();
  }
LAB_00103360:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock_);
  return;
}

Assistant:

void test_resource::do_deallocate(void *p, size_t bytes, size_t alignment)
{
    lock_guard guard{ m_lock_ };

    m_deallocations_.fetch_add(1, memory_order_relaxed);
    m_last_deallocated_address_.store(p, memory_order_relaxed);

    if (nullptr == p) {
        if (0 != bytes) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
            if (!is_quiet()) {
                formatBadBytesForNullptr(bytes, alignment);
                if (!is_no_abort()) {
                    std::abort();                                      // ABORT
                }
            }
        }
        else {
            m_last_deallocated_num_bytes_.store(0,
                                                memory_order_relaxed);
            m_last_deallocated_alignment_.store(alignment,
                                                memory_order_relaxed);
        }
        return;                                                       // RETURN
    }

    AlignedHeader *head = (AlignedHeader *)p - 1;

    bool miscError  = false;
    bool paramError = false;

    size_t     size            = 0;
    long long  allocationIndex = -1;

    // The following checks are done deliberately in the order shown to avoid a
    // possible bus error when attempting to read a misaligned 64-bit integer,
    // which can happen if an invalid address is passed to this method.  If the
    // address of the memory being deallocated is misaligned, it is very likely
    // that 'm_magic_number_' will not match the expected value, and so we will
    // skip the reading of 'm_bytes_' (a 64-bit integer).

    if (allocatedMemoryPattern != head->m_object_.m_magic_number_) {
        miscError = true;
    }
    else if (this != head->m_object_.m_pmr_) {
        miscError = true;
    }
    else {
        size            = head->m_object_.m_bytes_;
        allocationIndex = head->m_object_.m_index_;
    }

    // If there is evidence of corruption, this memory may have already been
    // freed.  On some platforms (but not others), the 'free' function will
    // scribble freed memory.  To get uniform behavior for test drivers, we
    // deliberately don't check over/underruns if 'miscError' is 'true'.

    int overrunBy  = 0;
    int underrunBy = 0;

    if (!miscError) {
        byte *pcBegin;
        byte *pcEnd;

        // Check the padding before the segment.  Go backwards so we will
        // report the trashed byte nearest the segment.

        pcBegin = (byte *)p - 1;
        pcEnd   = (byte *)&head->m_object_.m_padding_;

        for (byte *pc = pcBegin; pcEnd <= pc; --pc) {
            if (paddedMemoryByte != *pc) {
                underrunBy = static_cast<int>(pcBegin + 1 - pc);
                break;
            }
        }

        if (!underrunBy) {
            // Check the padding after the segment.

            byte *tail = (byte *)p + size;
            pcBegin = tail;
            pcEnd = tail + paddingSize;
            for (byte *pc = pcBegin; pc < pcEnd; ++pc) {
                if (paddedMemoryByte != *pc) {
                    overrunBy = static_cast<int>(pc + 1 - pcBegin);
                    break;
                }
            }
        }

        if (bytes != size || alignment != head->m_object_.m_alignment_) {
            paramError = true;
        }
    }

    // Now check for corrupted memory block and cross allocation.

    if (!miscError && !overrunBy && !underrunBy &&!paramError) {
        m_pmr_->deallocate(removeLink(m_list_,
                                      head->m_object_.m_address_),
                           sizeof(Link), alignof(Link));
    }
    else { // Any error, count it, report it
        if (miscError) {
            m_mismatches_.fetch_add(1, memory_order_relaxed);
        }
        if (paramError) {
            m_bad_deallocate_params_.fetch_add(1, memory_order_relaxed);
        }
        if (overrunBy || underrunBy) {
            m_bounds_errors_.fetch_add(1, memory_order_relaxed);
        }

        if (is_quiet()) {
            return;                                                   // RETURN
        }
        else {
            formatInvalidMemoryBlock(head, bytes, alignment,
                                     this, underrunBy, overrunBy);
            if (is_no_abort()) {
                return;                                               // RETURN
            }
            else {
                std::abort();                                          // ABORT
            }
        }
    }

    // At this point we know (almost) for sure that the memory block is
    // currently allocated from this object.  We now proceed to update our
    // statistics, stamp the block's header as deallocated, scribble over its
    // payload, and give it back to the underlying allocator supplied at
    // construction.  In verbose mode, we also report the deallocation event to
    // 'stdout'.

    m_last_deallocated_num_bytes_.store(static_cast<long long>(size),
                                        memory_order_relaxed);
    m_last_deallocated_alignment_.store(static_cast<long long>(alignment),
                                        memory_order_relaxed);

    m_blocks_in_use_.fetch_add(-1, memory_order_relaxed);

    m_bytes_in_use_.fetch_add(-static_cast<long long>(size),
                              memory_order_relaxed);

    head->m_object_.m_magic_number_ = deallocatedMemoryPattern;

    std::memset(p, static_cast<int>(scribbledMemoryByte), size);

    if (is_verbose()) {

        // In verbose mode, print a message to 'stdout' -- e.g.,
        //..
        //  TestAllocator local [245]: Deallocated 1 byte at 0x3c1b2740.
        //..

        printf("test_resource");

        if (!m_name_.empty()) {
            printf(" %.*s",
                   static_cast<int>(m_name_.length()), m_name_.data());
        }

        printf(" [%lld]: Deallocated %zu byte%s(aligned %zu) at %p.\n",
               allocationIndex,
               size,
               1 == size ? " " : "s ",
               alignment,
               p);

        std::fflush(stdout);
    }

    m_pmr_->deallocate(head, sizeof(AlignedHeader) + size + paddingSize);
}